

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDTDNotation
              (xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  xmlLinkPtr lk_00;
  void *pvVar5;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlChar *sysid_local;
  xmlChar *pubid_local;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  if (((writer == (xmlTextWriterPtr)0x0) || (name == (xmlChar *)0x0)) || (*name == '\0')) {
    writer_local._4_4_ = -1;
  }
  else {
    lk._0_4_ = 0;
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 == (xmlLinkPtr)0x0) {
      writer_local._4_4_ = -1;
    }
    else {
      pvVar5 = xmlLinkGetData(lk_00);
      if (pvVar5 != (void *)0x0) {
        if (*(int *)((long)pvVar5 + 8) == 7) {
          lk._0_4_ = xmlOutputBufferWriteString(writer->out," [");
          if ((int)lk < 0) {
            return -1;
          }
          if (writer->indent != 0) {
            iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
            if (iVar1 < 0) {
              return -1;
            }
            lk._0_4_ = iVar1 + (int)lk;
          }
          *(undefined4 *)((long)pvVar5 + 8) = 8;
        }
        else if (*(int *)((long)pvVar5 + 8) != 8) {
          return -1;
        }
      }
      if (writer->indent != 0) {
        iVar1 = xmlTextWriterWriteIndent(writer);
        if (iVar1 < 0) {
          return -1;
        }
        lk._0_4_ = iVar1 + (int)lk;
      }
      iVar1 = xmlOutputBufferWriteString(writer->out,"<!NOTATION ");
      if (iVar1 < 0) {
        writer_local._4_4_ = -1;
      }
      else {
        iVar2 = xmlOutputBufferWriteString(writer->out,(char *)name);
        if (iVar2 < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          lk._0_4_ = iVar2 + iVar1 + (int)lk;
          if (pubid != (xmlChar *)0x0) {
            iVar1 = xmlOutputBufferWriteString(writer->out," PUBLIC ");
            if (iVar1 < 0) {
              return -1;
            }
            iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
            if (iVar2 < 0) {
              return -1;
            }
            iVar3 = xmlOutputBufferWriteString(writer->out,(char *)pubid);
            if (iVar3 < 0) {
              return -1;
            }
            iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
            if (iVar4 < 0) {
              return -1;
            }
            lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1 + (int)lk;
          }
          if (sysid != (xmlChar *)0x0) {
            if (pubid == (xmlChar *)0x0) {
              iVar1 = xmlOutputBufferWriteString(writer->out," SYSTEM");
              if (iVar1 < 0) {
                return -1;
              }
              lk._0_4_ = iVar1 + (int)lk;
            }
            iVar1 = xmlOutputBufferWriteString(writer->out," ");
            if (iVar1 < 0) {
              return -1;
            }
            iVar2 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
            if (iVar2 < 0) {
              return -1;
            }
            iVar3 = xmlOutputBufferWriteString(writer->out,(char *)sysid);
            if (iVar3 < 0) {
              return -1;
            }
            iVar4 = xmlOutputBufferWrite(writer->out,1,&writer->qchar);
            if (iVar4 < 0) {
              return -1;
            }
            lk._0_4_ = iVar4 + iVar3 + iVar2 + iVar1 + (int)lk;
          }
          iVar1 = xmlOutputBufferWriteString(writer->out,">");
          if (iVar1 < 0) {
            writer_local._4_4_ = -1;
          }
          else {
            writer_local._4_4_ = iVar1 + (int)lk;
          }
        }
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteDTDNotation(xmlTextWriterPtr writer,
                              const xmlChar * name,
                              const xmlChar * pubid, const xmlChar * sysid)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL || name == NULL || *name == '\0')
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p != 0) {
        switch (p->state) {
            case XML_TEXTWRITER_DTD:
                count = xmlOutputBufferWriteString(writer->out, " [");
                if (count < 0)
                    return -1;
                sum += count;
                if (writer->indent) {
                    count = xmlOutputBufferWriteString(writer->out, "\n");
                    if (count < 0)
                        return -1;
                    sum += count;
                }
                p->state = XML_TEXTWRITER_DTD_TEXT;
                /* fallthrough */
            case XML_TEXTWRITER_DTD_TEXT:
                break;
            default:
                return -1;
        }
    }

    if (writer->indent) {
        count = xmlTextWriterWriteIndent(writer);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, "<!NOTATION ");
    if (count < 0)
        return -1;
    sum += count;
    count = xmlOutputBufferWriteString(writer->out, (const char *) name);
    if (count < 0)
        return -1;
    sum += count;

    if (pubid != 0) {
        count = xmlOutputBufferWriteString(writer->out, " PUBLIC ");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out, (const char *) pubid);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    if (sysid != 0) {
        if (pubid == 0) {
            count = xmlOutputBufferWriteString(writer->out, " SYSTEM");
            if (count < 0)
                return -1;
            sum += count;
        }
        count = xmlOutputBufferWriteString(writer->out, " ");
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
        count =
            xmlOutputBufferWriteString(writer->out, (const char *) sysid);
        if (count < 0)
            return -1;
        sum += count;
        count = xmlOutputBufferWrite(writer->out, 1, &writer->qchar);
        if (count < 0)
            return -1;
        sum += count;
    }

    count = xmlOutputBufferWriteString(writer->out, ">");
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}